

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall QHttpNetworkRequest::setPriority(QHttpNetworkRequest *this,Priority priority)

{
  QHttpNetworkRequestPrivate *pQVar1;
  Priority in_ESI;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)CONCAT44(in_ESI,in_ESI));
  pQVar1->priority = in_ESI;
  return;
}

Assistant:

void QHttpNetworkRequest::setPriority(Priority priority)
{
    d->priority = priority;
}